

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleBlockSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  undefined8 uVar2;
  ParserException *this_00;
  long *in_RSI;
  Token *nextToken;
  Token token;
  value in_stack_fffffffffffffebc;
  Scanner *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Scanner *in_stack_fffffffffffffed0;
  Token *in_stack_fffffffffffffed8;
  Token *in_stack_fffffffffffffee0;
  allocator *paVar3;
  value local_e8;
  allocator local_e1;
  string local_e0 [36];
  int local_bc;
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  Mark local_40;
  Mark local_20;
  long *local_10;
  
  local_10 = in_RSI;
  Scanner::pop(in_stack_fffffffffffffec0);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf25bcb);
  CollectionStack::PushCollectionType
            ((CollectionStack *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  while( true ) {
    bVar1 = Scanner::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      local_62 = 1;
      uVar2 = __cxa_allocate_exception(0x40);
      local_40 = Scanner::mark(in_stack_fffffffffffffed0);
      local_20 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"end of sequence not found",&local_61);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffed0,
                 (Mark *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (string *)in_stack_fffffffffffffec0);
      local_62 = 0;
      __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
    }
    Scanner::peek(in_stack_fffffffffffffec0);
    Token::Token(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if ((local_bc != 7) && (local_bc != 5)) break;
    Scanner::pop(in_stack_fffffffffffffec0);
    if (local_bc == 5) {
      local_e8 = FlowMap;
    }
    else {
      in_stack_fffffffffffffecf = Scanner::empty(in_stack_fffffffffffffec0);
      if (((bool)in_stack_fffffffffffffecf) ||
         ((in_stack_fffffffffffffec0 = (Scanner *)Scanner::peek(in_stack_fffffffffffffec0),
          *(TYPE *)((long)&(in_stack_fffffffffffffec0->INPUT).m_input + 4) != BLOCK_ENTRY &&
          (*(TYPE *)((long)&(in_stack_fffffffffffffec0->INPUT).m_input + 4) != BLOCK_SEQ_END)))) {
        HandleNode((SingleDocParser *)token.value.field_2._M_allocated_capacity,
                   (EventHandler *)token.value._M_string_length);
        local_e8 = NoCollection;
      }
      else {
        (**(code **)(*local_10 + 0x20))(local_10,&(in_stack_fffffffffffffec0->INPUT).m_mark,0);
        local_e8 = BlockSeq;
      }
    }
    Token::~Token((Token *)in_stack_fffffffffffffec0);
    if ((local_e8 != NoCollection) && (local_e8 != BlockSeq)) {
      std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::
      operator->((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
                 0xf25f74);
      CollectionStack::PopCollectionType((CollectionStack *)in_stack_fffffffffffffec0,local_e8);
      return;
    }
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x40);
  paVar3 = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"end of sequence not found",paVar3);
  ParserException::ParserException
            (this_00,(Mark *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             (string *)in_stack_fffffffffffffec0);
  __cxa_throw(this_00,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

void SingleDocParser::HandleBlockSequence(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockSeq);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_SEQ);

    Token token = m_scanner.peek();
    if (token.type != Token::BLOCK_ENTRY && token.type != Token::BLOCK_SEQ_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_SEQ);

    m_scanner.pop();
    if (token.type == Token::BLOCK_SEQ_END)
      break;

    // check for null
    if (!m_scanner.empty()) {
      const Token& nextToken = m_scanner.peek();
      if (nextToken.type == Token::BLOCK_ENTRY ||
          nextToken.type == Token::BLOCK_SEQ_END) {
        eventHandler.OnNull(nextToken.mark, NullAnchor);
        continue;
      }
    }

    HandleNode(eventHandler);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockSeq);
}